

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

void __thiscall cmListFileBacktrace::~cmListFileBacktrace(cmListFileBacktrace *this)

{
  cmListFileBacktrace *this_local;
  
  cmCommandContext::~cmCommandContext(&this->Context);
  return;
}

Assistant:

cmListFileBacktrace::~cmListFileBacktrace()
{
}